

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_GLSL_finalize(Context *ctx)

{
  uint uVar1;
  
  push_output(ctx,&ctx->globals);
  if (ctx->output == (Buffer *)0x0) {
    __assert_fail("ctx->output != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                  ,0x1d3,"void output_blank_line(Context *)");
  }
  if (ctx->isfail == 0) {
    buffer_append(ctx->output,ctx->endline,(long)ctx->endline_len);
  }
  if (0 < ctx->output_stack_len) {
    uVar1 = ctx->output_stack_len - 1;
    ctx->output_stack_len = uVar1;
    ctx->output = ctx->output_stack[uVar1];
    ctx->indent = ctx->indent_stack[uVar1];
    if (ctx->have_relative_input_registers != 0) {
      failf(ctx,"%s","Relative addressing of input registers not supported.");
    }
    push_output(ctx,&ctx->preflight);
    output_GLSL_uniform_array(ctx,REG_TYPE_CONST,ctx->uniform_float4_count);
    output_GLSL_uniform_array(ctx,REG_TYPE_CONSTINT,ctx->uniform_int4_count);
    output_GLSL_uniform_array(ctx,REG_TYPE_CONSTBOOL,ctx->uniform_bool_count);
    if (0 < ctx->output_stack_len) {
      uVar1 = ctx->output_stack_len - 1;
      ctx->output_stack_len = uVar1;
      ctx->output = ctx->output_stack[uVar1];
      ctx->indent = ctx->indent_stack[uVar1];
      return;
    }
  }
  __assert_fail("ctx->output_stack_len > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                ,0x173,"void pop_output(Context *)");
}

Assistant:

static void emit_GLSL_finalize(Context *ctx)
{
    // throw some blank lines around to make source more readable.
    push_output(ctx, &ctx->globals);
    output_blank_line(ctx);
    pop_output(ctx);

    // If we had a relative addressing of REG_TYPE_INPUT, we need to build
    //  an array for it at the start of main(). GLSL doesn't let you specify
    //  arrays of attributes.
    //vec4 blah_array[BIGGEST_ARRAY];
    if (ctx->have_relative_input_registers) // !!! FIXME
        fail(ctx, "Relative addressing of input registers not supported.");

    push_output(ctx, &ctx->preflight);
    output_GLSL_uniform_array(ctx, REG_TYPE_CONST, ctx->uniform_float4_count);
    output_GLSL_uniform_array(ctx, REG_TYPE_CONSTINT, ctx->uniform_int4_count);
    output_GLSL_uniform_array(ctx, REG_TYPE_CONSTBOOL, ctx->uniform_bool_count);
#ifdef MOJOSHADER_FLIP_RENDERTARGET
    if (shader_is_vertex(ctx))
        output_line(ctx, "uniform float vpFlip;");
#endif
    pop_output(ctx);
}